

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.cpp
# Opt level: O3

string * __thiscall
cali::Variant::to_string_abi_cxx11_(string *__return_storage_ptr__,Variant *this)

{
  ostringstream *this_00;
  uint64_t uVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  char cVar5;
  _Bool _Var6;
  cali_attr_type type;
  size_t sVar7;
  byte *pbVar8;
  void *pvVar9;
  char *__s;
  ulong uVar10;
  char *pcVar11;
  char cVar12;
  uint __len;
  ulong uVar13;
  cali_variant_t v;
  cali_variant_t v_00;
  cali_variant_t v_01;
  ostringstream os;
  undefined1 auStack_1d8 [12];
  uint local_1cc;
  ostream_iterator<unsigned_int,_char,_std::char_traits<char>_> local_1c8;
  long local_1b8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar1 = (this->m_v).type_and_size;
  switch((uint)uVar1 & 0xff) {
  case 1:
    v.value.v_uint = (this->m_v).value.v_uint;
    v.type_and_size = uVar1;
    sVar7 = cali_variant_get_size(v);
    pbVar8 = (byte *)cali_variant_get_data(&this->m_v);
    this_00 = (ostringstream *)(local_1b8 + 2);
    std::__cxx11::ostringstream::ostringstream(this_00);
    *(uint *)((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_1a8[0].field_2 +
                  *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    *(undefined8 *)((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18))
         = 2;
    lVar2 = *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18);
    if (acStack_c8[lVar2 + 1] == '\0') {
      std::ios::widen((char)auStack_1d8 + (char)lVar2 + '0');
      acStack_c8[lVar2 + 1] = '\x01';
    }
    acStack_c8[lVar2] = '0';
    local_1c8._M_string = ":";
    local_1c8._M_stream = (ostream_type *)this_00;
    if (0 < (long)sVar7) {
      uVar13 = sVar7 + 1;
      do {
        local_1cc = (uint)*pbVar8;
        std::ostream_iterator<unsigned_int,_char,_std::char_traits<char>_>::operator=
                  (&local_1c8,&local_1cc);
        pbVar8 = pbVar8 + 1;
        uVar13 = uVar13 - 1;
      } while (1 < uVar13);
    }
    std::__cxx11::stringbuf::str();
    goto LAB_00190bde;
  case 2:
    uVar1 = (this->m_v).value.v_uint;
    uVar13 = -uVar1;
    if (0 < (long)uVar1) {
      uVar13 = uVar1;
    }
    __len = 1;
    if (9 < uVar13) {
      uVar10 = uVar13;
      uVar4 = 4;
      do {
        __len = uVar4;
        if (uVar10 < 100) {
          __len = __len - 2;
          goto LAB_00190cb1;
        }
        if (uVar10 < 1000) {
          __len = __len - 1;
          goto LAB_00190cb1;
        }
        if (uVar10 < 10000) goto LAB_00190cb1;
        bVar3 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        uVar4 = __len + 4;
      } while (bVar3);
      __len = __len + 1;
    }
LAB_00190cb1:
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    std::__cxx11::string::_M_construct
              ((ulong)(local_1b8 + 2),(char)__len - (char)((long)uVar1 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_1a8[0]._M_dataplus._M_p + -((long)uVar1 >> 0x3f),__len,uVar13);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)(local_1b8 + 2));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p == &local_1a8[0].field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_00190c8c;
  case 3:
    uVar13 = (this->m_v).value.v_uint;
    cVar12 = '\x01';
    if (9 < uVar13) {
      uVar10 = uVar13;
      cVar5 = '\x04';
      do {
        cVar12 = cVar5;
        if (uVar10 < 100) {
          cVar12 = cVar12 + -2;
          goto LAB_00190c4d;
        }
        if (uVar10 < 1000) {
          cVar12 = cVar12 + -1;
          goto LAB_00190c4d;
        }
        if (uVar10 < 10000) goto LAB_00190c4d;
        bVar3 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar5 = cVar12 + '\x04';
      } while (bVar3);
      cVar12 = cVar12 + '\x01';
    }
LAB_00190c4d:
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    std::__cxx11::string::_M_construct((ulong)(local_1b8 + 2),cVar12);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_1a8[0]._M_dataplus._M_p,(uint)local_1a8[0]._M_string_length,uVar13);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)(local_1b8 + 2));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p == &local_1a8[0].field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_00190c8c;
  case 4:
    pvVar9 = cali_variant_get_data(&this->m_v);
    cali_variant_get_size(this->m_v);
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               (ulong)pvVar9);
    break;
  case 5:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 2));
    *(uint *)((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_1a8[0].field_2 +
                  *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    cali_variant_to_uint(this->m_v,(_Bool *)0x0);
    std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 2));
    std::__cxx11::stringbuf::str();
    goto LAB_00190bde;
  case 6:
    __gnu_cxx::__to_xstring<std::__cxx11::string,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1b8 + 2),
               vsnprintf,0x148,"%f",(this->m_v).value.v_uint);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)(local_1b8 + 2));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p == &local_1a8[0].field_2) {
      return __return_storage_ptr__;
    }
LAB_00190c8c:
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    break;
  case 7:
    v_01.value.v_uint = (this->m_v).value.v_uint;
    v_01.type_and_size = uVar1;
    _Var6 = cali_variant_to_bool(v_01,(_Bool *)0x0);
    pcVar11 = "false";
    if (_Var6) {
      pcVar11 = "true";
    }
    std::__cxx11::string::_M_replace
              ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
               (ulong)pcVar11);
    break;
  case 8:
    v_00.value.v_uint = (this->m_v).value.v_uint;
    v_00.type_and_size = uVar1;
    type = cali_variant_to_type(v_00,(_Bool *)0x0);
    __s = cali_type2string(type);
    pcVar11 = (char *)__return_storage_ptr__->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar11,(ulong)__s);
    break;
  case 9:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 2));
    *(uint *)((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8) =
         *(uint *)((long)&local_1a8[0].field_2 +
                  *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8) & 0xffffffb5 | 8;
    cali_variant_get_data(&this->m_v);
    std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 2));
    std::__cxx11::stringbuf::str();
LAB_00190bde:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1c8);
    if (local_1c8._M_stream != (ostream_type *)local_1b8) {
      operator_delete(local_1c8._M_stream,local_1b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 2));
    std::ios_base::~ios_base(local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Variant::to_string() const
{
    std::string ret;

    switch (this->type()) {
    case CALI_TYPE_INV:
        break;
    case CALI_TYPE_USR:
        {
            size_t      size = this->size();
            const void* ptr  = data();

            std::ostringstream os;

            std::copy(
                static_cast<const unsigned char*>(ptr),
                static_cast<const unsigned char*>(ptr) + size,
                std::ostream_iterator<unsigned>(os << std::hex << std::setw(2) << std::setfill('0'), ":")
            );

            ret = os.str();
        }
        break;
    case CALI_TYPE_INT:
        ret = std::to_string(m_v.value.v_int);
        break;
    case CALI_TYPE_UINT:
        ret = std::to_string(m_v.value.v_uint);
        break;
    case CALI_TYPE_STRING:
        {
            const char* str = static_cast<const char*>(data());
            std::size_t len = size();

            if (len && str[len - 1] == 0)
                --len;

            ret.assign(str, len);
        }
        break;
    case CALI_TYPE_ADDR:
        {
            std::ostringstream os;
            os << std::hex << to_uint();
            ret = os.str();
        }
        break;
    case CALI_TYPE_DOUBLE:
        ret = std::to_string(m_v.value.v_double);
        break;
    case CALI_TYPE_BOOL:
        ret = to_bool() ? "true" : "false";
        break;
    case CALI_TYPE_TYPE:
        ret = cali_type2string(to_attr_type());
        break;
    case CALI_TYPE_PTR:
        {
            std::ostringstream os;
            os << std::hex << reinterpret_cast<uint64_t>(data());
            ret = os.str();
        }
    }

    return ret;
}